

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.cxx
# Opt level: O2

void __thiscall ViewTest::copyConstructorTest(ViewTest *this)

{
  int iVar1;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_00;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_01;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_02;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_03;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_04;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_05;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_06;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_07;
  size_t sVar2;
  size_t sVar3;
  reference piVar4;
  reference piVar5;
  reference piVar6;
  reference piVar7;
  size_t j_3;
  size_t k;
  ulong uVar8;
  size_t k_3;
  size_t j;
  ulong uVar9;
  ulong uVar10;
  size_t j_10;
  int *data;
  bool local_d1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape;
  View<int,_false,_std::allocator<unsigned_long>_> v;
  View<int,_false,_std::allocator<unsigned_long>_> w;
  
  andres::View<int,_false,_std::allocator<unsigned_long>_>::View
            (&v,&this->scalar_,(allocator_type *)&w);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::View(&w,&v);
  sVar2 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension(&w);
  sVar3 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension(&v);
  if ((sVar2 == sVar3) && (w.geometry_.size_ == v.geometry_.size_)) {
    piVar4 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                       ((View<int,false,std::allocator<unsigned_long>> *)&w,0);
    piVar5 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                       ((View<int,false,std::allocator<unsigned_long>> *)&v,0);
    shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = piVar4 == piVar5;
  }
  else {
    shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = false;
  }
  test((bool *)&shape);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&w.geometry_);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::View
            (&v,&this->scalar_,(allocator_type *)&w);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::View
            ((View<int,_true,_std::allocator<unsigned_long>_> *)&w,&v);
  sVar2 = andres::View<int,_true,_std::allocator<unsigned_long>_>::dimension
                    ((View<int,_true,_std::allocator<unsigned_long>_> *)&w);
  sVar3 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension(&v);
  if ((sVar2 == sVar3) && (w.geometry_.size_ == v.geometry_.size_)) {
    piVar6 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                       ((View<int,true,std::allocator<unsigned_long>> *)&w,0);
    piVar4 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                       ((View<int,false,std::allocator<unsigned_long>> *)&v,0);
    shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = piVar6 == piVar4;
  }
  else {
    shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = false;
  }
  test((bool *)&shape);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&w.geometry_);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::View
            ((View<int,_true,_std::allocator<unsigned_long>_> *)&v,&this->scalar_,
             (allocator_type *)&w);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::View
            ((View<int,_true,_std::allocator<unsigned_long>_> *)&w,
             (View<int,_true,_std::allocator<unsigned_long>_> *)&v);
  sVar2 = andres::View<int,_true,_std::allocator<unsigned_long>_>::dimension
                    ((View<int,_true,_std::allocator<unsigned_long>_> *)&w);
  sVar3 = andres::View<int,_true,_std::allocator<unsigned_long>_>::dimension
                    ((View<int,_true,_std::allocator<unsigned_long>_> *)&v);
  if ((sVar2 == sVar3) && (w.geometry_.size_ == v.geometry_.size_)) {
    piVar6 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                       ((View<int,true,std::allocator<unsigned_long>> *)&w,0);
    piVar7 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                       ((View<int,true,std::allocator<unsigned_long>> *)&v,0);
    shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = piVar6 == piVar7;
  }
  else {
    shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = false;
  }
  test((bool *)&shape);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&w.geometry_);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,1,(allocator_type *)&v);
  begin._M_current._1_7_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._1_7_;
  begin._M_current._0_1_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_1_;
  *begin._M_current = 0x18;
  data = this->data_;
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&v,begin,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,data,&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)&w);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::View(&w,&v);
  sVar2 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension(&w);
  sVar3 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension(&v);
  if ((sVar2 == sVar3) && (w.geometry_.size_ == v.geometry_.size_)) {
    piVar4 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                       ((View<int,false,std::allocator<unsigned_long>> *)&w,0);
    piVar5 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                       ((View<int,false,std::allocator<unsigned_long>> *)&v,0);
    local_d1 = piVar4 == piVar5;
  }
  else {
    local_d1 = false;
  }
  test(&local_d1);
  for (uVar9 = 0; uVar9 = uVar9 & 0xffff,
      uVar9 < (ulong)((long)shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      CONCAT71(shape.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start._1_7_,
                               shape.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start._0_1_) >> 3);
      uVar9 = (ulong)((int)uVar9 + 1)) {
    sVar2 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape(&w,uVar9);
    sVar3 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape(&v,uVar9);
    local_d1 = sVar2 == sVar3;
    test(&local_d1);
  }
  for (uVar9 = 0; uVar9 < v.geometry_.size_; uVar9 = uVar9 + 1) {
    piVar4 = andres::View<int,_false,_std::allocator<unsigned_long>_>::operator()(&w,uVar9);
    iVar1 = *piVar4;
    piVar4 = andres::View<int,_false,_std::allocator<unsigned_long>_>::operator()(&v,uVar9);
    local_d1 = iVar1 == *piVar4;
    test(&local_d1);
  }
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&w.geometry_);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,1,(allocator_type *)&v);
  begin_00._M_current._1_7_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._1_7_;
  begin_00._M_current._0_1_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_1_;
  *begin_00._M_current = 0x18;
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&v,begin_00,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,data,&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)&w);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::View
            ((View<int,_true,_std::allocator<unsigned_long>_> *)&w,&v);
  sVar2 = andres::View<int,_true,_std::allocator<unsigned_long>_>::dimension
                    ((View<int,_true,_std::allocator<unsigned_long>_> *)&w);
  sVar3 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension(&v);
  if ((sVar2 == sVar3) && (w.geometry_.size_ == v.geometry_.size_)) {
    piVar6 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                       ((View<int,true,std::allocator<unsigned_long>> *)&w,0);
    piVar4 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                       ((View<int,false,std::allocator<unsigned_long>> *)&v,0);
    local_d1 = piVar6 == piVar4;
  }
  else {
    local_d1 = false;
  }
  test(&local_d1);
  for (uVar9 = 0; uVar9 = uVar9 & 0xffff,
      uVar9 < (ulong)((long)shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      CONCAT71(shape.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start._1_7_,
                               shape.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start._0_1_) >> 3);
      uVar9 = (ulong)((int)uVar9 + 1)) {
    sVar2 = andres::View<int,_true,_std::allocator<unsigned_long>_>::shape
                      ((View<int,_true,_std::allocator<unsigned_long>_> *)&w,uVar9);
    sVar3 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape(&v,uVar9);
    local_d1 = sVar2 == sVar3;
    test(&local_d1);
  }
  for (uVar9 = 0; uVar9 < v.geometry_.size_; uVar9 = uVar9 + 1) {
    piVar6 = andres::View<int,_true,_std::allocator<unsigned_long>_>::operator()
                       ((View<int,_true,_std::allocator<unsigned_long>_> *)&w,uVar9);
    iVar1 = *piVar6;
    piVar4 = andres::View<int,_false,_std::allocator<unsigned_long>_>::operator()(&v,uVar9);
    local_d1 = iVar1 == *piVar4;
    test(&local_d1);
  }
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&w.geometry_);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,1,(allocator_type *)&v);
  begin_01._M_current._1_7_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._1_7_;
  begin_01._M_current._0_1_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_1_;
  *begin_01._M_current = 0x18;
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)&v,begin_01,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,data,&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)&w);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::View
            ((View<int,_true,_std::allocator<unsigned_long>_> *)&w,
             (View<int,_true,_std::allocator<unsigned_long>_> *)&v);
  sVar2 = andres::View<int,_true,_std::allocator<unsigned_long>_>::dimension
                    ((View<int,_true,_std::allocator<unsigned_long>_> *)&w);
  sVar3 = andres::View<int,_true,_std::allocator<unsigned_long>_>::dimension
                    ((View<int,_true,_std::allocator<unsigned_long>_> *)&v);
  if ((sVar2 == sVar3) && (w.geometry_.size_ == v.geometry_.size_)) {
    piVar6 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                       ((View<int,true,std::allocator<unsigned_long>> *)&w,0);
    piVar7 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                       ((View<int,true,std::allocator<unsigned_long>> *)&v,0);
    local_d1 = piVar6 == piVar7;
  }
  else {
    local_d1 = false;
  }
  test(&local_d1);
  for (uVar9 = 0; uVar9 = uVar9 & 0xffff,
      uVar9 < (ulong)((long)shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      CONCAT71(shape.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start._1_7_,
                               shape.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start._0_1_) >> 3);
      uVar9 = (ulong)((int)uVar9 + 1)) {
    sVar2 = andres::View<int,_true,_std::allocator<unsigned_long>_>::shape
                      ((View<int,_true,_std::allocator<unsigned_long>_> *)&w,uVar9);
    sVar3 = andres::View<int,_true,_std::allocator<unsigned_long>_>::shape
                      ((View<int,_true,_std::allocator<unsigned_long>_> *)&v,uVar9);
    local_d1 = sVar2 == sVar3;
    test(&local_d1);
  }
  for (uVar9 = 0; uVar9 < v.geometry_.size_; uVar9 = uVar9 + 1) {
    piVar6 = andres::View<int,_true,_std::allocator<unsigned_long>_>::operator()
                       ((View<int,_true,_std::allocator<unsigned_long>_> *)&w,uVar9);
    iVar1 = *piVar6;
    piVar6 = andres::View<int,_true,_std::allocator<unsigned_long>_>::operator()
                       ((View<int,_true,_std::allocator<unsigned_long>_> *)&v,uVar9);
    local_d1 = iVar1 == *piVar6;
    test(&local_d1);
  }
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&w.geometry_);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,2,(allocator_type *)&v);
  begin_02._M_current._1_7_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._1_7_;
  begin_02._M_current._0_1_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_1_;
  *begin_02._M_current = 6;
  begin_02._M_current[1] = 4;
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&v,begin_02,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,data,&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)&w);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::View(&w,&v);
  sVar2 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension(&w);
  sVar3 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension(&v);
  if ((sVar2 == sVar3) && (w.geometry_.size_ == v.geometry_.size_)) {
    piVar4 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                       ((View<int,false,std::allocator<unsigned_long>> *)&w,0);
    piVar5 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                       ((View<int,false,std::allocator<unsigned_long>> *)&v,0);
    local_d1 = piVar4 == piVar5;
  }
  else {
    local_d1 = false;
  }
  test(&local_d1);
  for (uVar9 = 0; uVar9 = uVar9 & 0xffff,
      uVar9 < (ulong)((long)shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      CONCAT71(shape.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start._1_7_,
                               shape.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start._0_1_) >> 3);
      uVar9 = (ulong)((int)uVar9 + 1)) {
    sVar2 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape(&w,uVar9);
    sVar3 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape(&v,uVar9);
    local_d1 = sVar2 == sVar3;
    test(&local_d1);
  }
  for (uVar9 = 0; uVar9 < v.geometry_.size_; uVar9 = uVar9 + 1) {
    piVar4 = andres::View<int,_false,_std::allocator<unsigned_long>_>::operator()(&w,uVar9);
    iVar1 = *piVar4;
    piVar4 = andres::View<int,_false,_std::allocator<unsigned_long>_>::operator()(&v,uVar9);
    local_d1 = iVar1 == *piVar4;
    test(&local_d1);
  }
  uVar9 = 0;
  while( true ) {
    sVar2 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape(&v,0);
    if (sVar2 <= uVar9) break;
    uVar8 = 0;
    while( true ) {
      sVar2 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape(&v,1);
      if (sVar2 <= uVar8) break;
      piVar4 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)&w,uVar9,uVar8);
      iVar1 = *piVar4;
      piVar4 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)&v,uVar9,uVar8);
      local_d1 = iVar1 == *piVar4;
      test(&local_d1);
      uVar8 = uVar8 + 1;
    }
    uVar9 = uVar9 + 1;
  }
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&w.geometry_);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,2,(allocator_type *)&v);
  begin_03._M_current._1_7_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._1_7_;
  begin_03._M_current._0_1_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_1_;
  *begin_03._M_current = 6;
  begin_03._M_current[1] = 4;
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&v,begin_03,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,data,&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)&w);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::View
            ((View<int,_true,_std::allocator<unsigned_long>_> *)&w,&v);
  sVar2 = andres::View<int,_true,_std::allocator<unsigned_long>_>::dimension
                    ((View<int,_true,_std::allocator<unsigned_long>_> *)&w);
  sVar3 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension(&v);
  if ((sVar2 == sVar3) && (w.geometry_.size_ == v.geometry_.size_)) {
    piVar6 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                       ((View<int,true,std::allocator<unsigned_long>> *)&w,0);
    piVar4 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                       ((View<int,false,std::allocator<unsigned_long>> *)&v,0);
    local_d1 = piVar6 == piVar4;
  }
  else {
    local_d1 = false;
  }
  test(&local_d1);
  for (uVar9 = 0; uVar9 = uVar9 & 0xffff,
      uVar9 < (ulong)((long)shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      CONCAT71(shape.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start._1_7_,
                               shape.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start._0_1_) >> 3);
      uVar9 = (ulong)((int)uVar9 + 1)) {
    sVar2 = andres::View<int,_true,_std::allocator<unsigned_long>_>::shape
                      ((View<int,_true,_std::allocator<unsigned_long>_> *)&w,uVar9);
    sVar3 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape(&v,uVar9);
    local_d1 = sVar2 == sVar3;
    test(&local_d1);
  }
  for (uVar9 = 0; uVar9 < v.geometry_.size_; uVar9 = uVar9 + 1) {
    piVar6 = andres::View<int,_true,_std::allocator<unsigned_long>_>::operator()
                       ((View<int,_true,_std::allocator<unsigned_long>_> *)&w,uVar9);
    iVar1 = *piVar6;
    piVar4 = andres::View<int,_false,_std::allocator<unsigned_long>_>::operator()(&v,uVar9);
    local_d1 = iVar1 == *piVar4;
    test(&local_d1);
  }
  uVar9 = 0;
  while( true ) {
    sVar2 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape(&v,0);
    if (sVar2 <= uVar9) break;
    uVar8 = 0;
    while( true ) {
      sVar2 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape(&v,1);
      if (sVar2 <= uVar8) break;
      piVar6 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                         ((View<int,true,std::allocator<unsigned_long>> *)&w,uVar9,uVar8);
      iVar1 = *piVar6;
      piVar4 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)&v,uVar9,uVar8);
      local_d1 = iVar1 == *piVar4;
      test(&local_d1);
      uVar8 = uVar8 + 1;
    }
    uVar9 = uVar9 + 1;
  }
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&w.geometry_);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,2,(allocator_type *)&v);
  begin_04._M_current._1_7_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._1_7_;
  begin_04._M_current._0_1_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_1_;
  *begin_04._M_current = 6;
  begin_04._M_current[1] = 4;
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)&v,begin_04,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,data,&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)&w);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::View
            ((View<int,_true,_std::allocator<unsigned_long>_> *)&w,
             (View<int,_true,_std::allocator<unsigned_long>_> *)&v);
  sVar2 = andres::View<int,_true,_std::allocator<unsigned_long>_>::dimension
                    ((View<int,_true,_std::allocator<unsigned_long>_> *)&w);
  sVar3 = andres::View<int,_true,_std::allocator<unsigned_long>_>::dimension
                    ((View<int,_true,_std::allocator<unsigned_long>_> *)&v);
  if ((sVar2 == sVar3) && (w.geometry_.size_ == v.geometry_.size_)) {
    piVar6 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                       ((View<int,true,std::allocator<unsigned_long>> *)&w,0);
    piVar7 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                       ((View<int,true,std::allocator<unsigned_long>> *)&v,0);
    local_d1 = piVar6 == piVar7;
  }
  else {
    local_d1 = false;
  }
  test(&local_d1);
  for (uVar9 = 0; uVar9 = uVar9 & 0xffff,
      uVar9 < (ulong)((long)shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      CONCAT71(shape.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start._1_7_,
                               shape.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start._0_1_) >> 3);
      uVar9 = (ulong)((int)uVar9 + 1)) {
    sVar2 = andres::View<int,_true,_std::allocator<unsigned_long>_>::shape
                      ((View<int,_true,_std::allocator<unsigned_long>_> *)&w,uVar9);
    sVar3 = andres::View<int,_true,_std::allocator<unsigned_long>_>::shape
                      ((View<int,_true,_std::allocator<unsigned_long>_> *)&v,uVar9);
    local_d1 = sVar2 == sVar3;
    test(&local_d1);
  }
  for (uVar9 = 0; uVar9 < v.geometry_.size_; uVar9 = uVar9 + 1) {
    piVar6 = andres::View<int,_true,_std::allocator<unsigned_long>_>::operator()
                       ((View<int,_true,_std::allocator<unsigned_long>_> *)&w,uVar9);
    iVar1 = *piVar6;
    piVar6 = andres::View<int,_true,_std::allocator<unsigned_long>_>::operator()
                       ((View<int,_true,_std::allocator<unsigned_long>_> *)&v,uVar9);
    local_d1 = iVar1 == *piVar6;
    test(&local_d1);
  }
  uVar9 = 0;
  while( true ) {
    sVar2 = andres::View<int,_true,_std::allocator<unsigned_long>_>::shape
                      ((View<int,_true,_std::allocator<unsigned_long>_> *)&v,0);
    if (sVar2 <= uVar9) break;
    uVar8 = 0;
    while( true ) {
      sVar2 = andres::View<int,_true,_std::allocator<unsigned_long>_>::shape
                        ((View<int,_true,_std::allocator<unsigned_long>_> *)&v,1);
      if (sVar2 <= uVar8) break;
      piVar6 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                         ((View<int,true,std::allocator<unsigned_long>> *)&w,uVar9,uVar8);
      iVar1 = *piVar6;
      piVar6 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                         ((View<int,true,std::allocator<unsigned_long>> *)&v,uVar9,uVar8);
      local_d1 = iVar1 == *piVar6;
      test(&local_d1);
      uVar8 = uVar8 + 1;
    }
    uVar9 = uVar9 + 1;
  }
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&w.geometry_);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,3,(allocator_type *)&v);
  begin_05._M_current._1_7_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._1_7_;
  begin_05._M_current._0_1_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_1_;
  *begin_05._M_current = 3;
  begin_05._M_current[1] = 4;
  begin_05._M_current[2] = 2;
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&v,begin_05,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,data,&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)&w);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::View(&w,&v);
  sVar2 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension(&w);
  sVar3 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension(&v);
  if ((sVar2 == sVar3) && (w.geometry_.size_ == v.geometry_.size_)) {
    piVar4 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                       ((View<int,false,std::allocator<unsigned_long>> *)&w,0);
    piVar5 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                       ((View<int,false,std::allocator<unsigned_long>> *)&v,0);
    local_d1 = piVar4 == piVar5;
  }
  else {
    local_d1 = false;
  }
  test(&local_d1);
  for (uVar9 = 0; uVar9 = uVar9 & 0xffff,
      uVar9 < (ulong)((long)shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      CONCAT71(shape.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start._1_7_,
                               shape.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start._0_1_) >> 3);
      uVar9 = (ulong)((int)uVar9 + 1)) {
    sVar2 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape(&w,uVar9);
    sVar3 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape(&v,uVar9);
    local_d1 = sVar2 == sVar3;
    test(&local_d1);
  }
  for (uVar9 = 0; uVar9 < v.geometry_.size_; uVar9 = uVar9 + 1) {
    piVar4 = andres::View<int,_false,_std::allocator<unsigned_long>_>::operator()(&w,uVar9);
    iVar1 = *piVar4;
    piVar4 = andres::View<int,_false,_std::allocator<unsigned_long>_>::operator()(&v,uVar9);
    local_d1 = iVar1 == *piVar4;
    test(&local_d1);
  }
  uVar9 = 0;
  while( true ) {
    sVar2 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape(&v,0);
    if (sVar2 <= uVar9) break;
    uVar8 = 0;
    while( true ) {
      sVar2 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape(&v,1);
      if (sVar2 <= uVar8) break;
      uVar10 = 0;
      while( true ) {
        sVar2 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape(&v,2);
        if (sVar2 <= uVar10) break;
        piVar4 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                           ((View<int,false,std::allocator<unsigned_long>> *)&v,uVar9,uVar8,uVar10);
        iVar1 = *piVar4;
        piVar4 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                           ((View<int,false,std::allocator<unsigned_long>> *)&w,uVar9,uVar8,uVar10);
        local_d1 = iVar1 == *piVar4;
        test(&local_d1);
        uVar10 = uVar10 + 1;
      }
      uVar8 = uVar8 + 1;
    }
    uVar9 = uVar9 + 1;
  }
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&w.geometry_);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,3,(allocator_type *)&v);
  begin_06._M_current._1_7_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._1_7_;
  begin_06._M_current._0_1_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_1_;
  *begin_06._M_current = 3;
  begin_06._M_current[1] = 4;
  begin_06._M_current[2] = 2;
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&v,begin_06,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,data,&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)&w);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::View
            ((View<int,_true,_std::allocator<unsigned_long>_> *)&w,&v);
  sVar2 = andres::View<int,_true,_std::allocator<unsigned_long>_>::dimension
                    ((View<int,_true,_std::allocator<unsigned_long>_> *)&w);
  sVar3 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension(&v);
  if ((sVar2 == sVar3) && (w.geometry_.size_ == v.geometry_.size_)) {
    piVar6 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                       ((View<int,true,std::allocator<unsigned_long>> *)&w,0);
    piVar4 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                       ((View<int,false,std::allocator<unsigned_long>> *)&v,0);
    local_d1 = piVar6 == piVar4;
  }
  else {
    local_d1 = false;
  }
  test(&local_d1);
  for (uVar9 = 0; uVar9 = uVar9 & 0xffff,
      uVar9 < (ulong)((long)shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      CONCAT71(shape.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start._1_7_,
                               shape.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start._0_1_) >> 3);
      uVar9 = (ulong)((int)uVar9 + 1)) {
    sVar2 = andres::View<int,_true,_std::allocator<unsigned_long>_>::shape
                      ((View<int,_true,_std::allocator<unsigned_long>_> *)&w,uVar9);
    sVar3 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape(&v,uVar9);
    local_d1 = sVar2 == sVar3;
    test(&local_d1);
  }
  for (uVar9 = 0; uVar9 < v.geometry_.size_; uVar9 = uVar9 + 1) {
    piVar6 = andres::View<int,_true,_std::allocator<unsigned_long>_>::operator()
                       ((View<int,_true,_std::allocator<unsigned_long>_> *)&w,uVar9);
    iVar1 = *piVar6;
    piVar4 = andres::View<int,_false,_std::allocator<unsigned_long>_>::operator()(&v,uVar9);
    local_d1 = iVar1 == *piVar4;
    test(&local_d1);
  }
  uVar9 = 0;
  while( true ) {
    sVar2 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape(&v,0);
    if (sVar2 <= uVar9) break;
    uVar8 = 0;
    while( true ) {
      sVar2 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape(&v,1);
      if (sVar2 <= uVar8) break;
      uVar10 = 0;
      while( true ) {
        sVar2 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape(&v,2);
        if (sVar2 <= uVar10) break;
        piVar4 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                           ((View<int,false,std::allocator<unsigned_long>> *)&v,uVar9,uVar8,uVar10);
        iVar1 = *piVar4;
        piVar6 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                           ((View<int,true,std::allocator<unsigned_long>> *)&w,uVar9,uVar8,uVar10);
        local_d1 = iVar1 == *piVar6;
        test(&local_d1);
        uVar10 = uVar10 + 1;
      }
      uVar8 = uVar8 + 1;
    }
    uVar9 = uVar9 + 1;
  }
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&w.geometry_);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,3,(allocator_type *)&v);
  begin_07._M_current._1_7_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._1_7_;
  begin_07._M_current._0_1_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_1_;
  *begin_07._M_current = 3;
  begin_07._M_current[1] = 4;
  begin_07._M_current[2] = 2;
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)&v,begin_07,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,data,&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)&w);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::View
            ((View<int,_true,_std::allocator<unsigned_long>_> *)&w,
             (View<int,_true,_std::allocator<unsigned_long>_> *)&v);
  sVar2 = andres::View<int,_true,_std::allocator<unsigned_long>_>::dimension
                    ((View<int,_true,_std::allocator<unsigned_long>_> *)&w);
  sVar3 = andres::View<int,_true,_std::allocator<unsigned_long>_>::dimension
                    ((View<int,_true,_std::allocator<unsigned_long>_> *)&v);
  if ((sVar2 == sVar3) && (w.geometry_.size_ == v.geometry_.size_)) {
    piVar6 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                       ((View<int,true,std::allocator<unsigned_long>> *)&w,0);
    piVar7 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                       ((View<int,true,std::allocator<unsigned_long>> *)&v,0);
    local_d1 = piVar6 == piVar7;
  }
  else {
    local_d1 = false;
  }
  test(&local_d1);
  for (uVar9 = 0; uVar9 = uVar9 & 0xffff,
      uVar9 < (ulong)((long)shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      CONCAT71(shape.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start._1_7_,
                               shape.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start._0_1_) >> 3);
      uVar9 = (ulong)((int)uVar9 + 1)) {
    sVar2 = andres::View<int,_true,_std::allocator<unsigned_long>_>::shape
                      ((View<int,_true,_std::allocator<unsigned_long>_> *)&w,uVar9);
    sVar3 = andres::View<int,_true,_std::allocator<unsigned_long>_>::shape
                      ((View<int,_true,_std::allocator<unsigned_long>_> *)&v,uVar9);
    local_d1 = sVar2 == sVar3;
    test(&local_d1);
  }
  for (uVar9 = 0; uVar9 < v.geometry_.size_; uVar9 = uVar9 + 1) {
    piVar6 = andres::View<int,_true,_std::allocator<unsigned_long>_>::operator()
                       ((View<int,_true,_std::allocator<unsigned_long>_> *)&w,uVar9);
    iVar1 = *piVar6;
    piVar6 = andres::View<int,_true,_std::allocator<unsigned_long>_>::operator()
                       ((View<int,_true,_std::allocator<unsigned_long>_> *)&v,uVar9);
    local_d1 = iVar1 == *piVar6;
    test(&local_d1);
  }
  uVar9 = 0;
  while( true ) {
    sVar2 = andres::View<int,_true,_std::allocator<unsigned_long>_>::shape
                      ((View<int,_true,_std::allocator<unsigned_long>_> *)&v,0);
    if (sVar2 <= uVar9) break;
    uVar8 = 0;
    while( true ) {
      sVar2 = andres::View<int,_true,_std::allocator<unsigned_long>_>::shape
                        ((View<int,_true,_std::allocator<unsigned_long>_> *)&v,1);
      if (sVar2 <= uVar8) break;
      uVar10 = 0;
      while( true ) {
        sVar2 = andres::View<int,_true,_std::allocator<unsigned_long>_>::shape
                          ((View<int,_true,_std::allocator<unsigned_long>_> *)&v,2);
        if (sVar2 <= uVar10) break;
        piVar6 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                           ((View<int,true,std::allocator<unsigned_long>> *)&v,uVar9,uVar8,uVar10);
        iVar1 = *piVar6;
        piVar6 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                           ((View<int,true,std::allocator<unsigned_long>> *)&w,uVar9,uVar8,uVar10);
        local_d1 = iVar1 == *piVar6;
        test(&local_d1);
        uVar10 = uVar10 + 1;
      }
      uVar8 = uVar8 + 1;
    }
    uVar9 = uVar9 + 1;
  }
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&w.geometry_);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  return;
}

Assistant:

void ViewTest::copyConstructorTest() {
    // scalar 
    {
        // false, false
        {
            andres::View<int, false> v(&scalar_);
            andres::View<int, false> w(v);

            test(w.dimension() == v.dimension() &&
                   w.size() == v.size() &&
                   &(w(0)) == &(v(0)));
        }
        // false, true
        {
            andres::View<int, false> v(&scalar_);
            andres::View<int, true> w(v);

            test(w.dimension() == v.dimension() &&
                   w.size() == v.size() &&
                   &(w(0)) == &(v(0)));
        }
        // true, true
        {
            andres::View<int, true> v(&scalar_);
            andres::View<int, true> w(v);

            test(w.dimension() == v.dimension() &&
                   w.size() == v.size() &&
                   &(w(0)) == &(v(0)));
        }
    }
    // 1D 
    {
        // false, false
        {
            std::vector<std::size_t> shape(1);
            shape[0] = 24;
            andres::View<int, false> v(shape.begin(), shape.end(), data_);
            andres::View<int, false> w(v);

            test(w.dimension() == v.dimension() &&
                   w.size() == v.size() &&
                   &(w(0)) == &(v(0))
            );
            for(unsigned short j=0; j<shape.size(); ++j) {
                test(w.shape(j) == v.shape(j));
            }
            for(std::size_t j=0; j<v.size(); ++j) {
                test(w(j) == v(j));
            }
        }
        // false, true
        {
            std::vector<std::size_t> shape(1);
            shape[0] = 24;
            andres::View<int, false> v(shape.begin(), shape.end(), data_);
            andres::View<int, true> w(v);

            test(w.dimension() == v.dimension() &&
                   w.size() == v.size() &&
                   &(w(0)) == &(v(0))
            );
            for(unsigned short j=0; j<shape.size(); ++j) {
                test(w.shape(j) == v.shape(j));
            }
            for(std::size_t j=0; j<v.size(); ++j) {
                test(w(j) == v(j));
            }
        }
        // true, true
        {
            std::vector<std::size_t> shape(1);
            shape[0] = 24;
            andres::View<int, true> v(shape.begin(), shape.end(), data_);
            andres::View<int, true> w(v);

            test(w.dimension() == v.dimension() &&
                   w.size() == v.size() &&
                   &(w(0)) == &(v(0))
            );
            for(unsigned short j=0; j<shape.size(); ++j) {
                test(w.shape(j) == v.shape(j));
            }
            for(std::size_t j=0; j<v.size(); ++j) {
                test(w(j) == v(j));
            }
        }
    }
    // 2D 
    {
        // false, false
        {
            std::vector<std::size_t> shape(2);
            shape[0] = 6;
            shape[1] = 4;
            andres::View<int> v(shape.begin(), shape.end(), data_);
            andres::View<int> w(v);

            test(w.dimension() == v.dimension() &&
                   w.size() == v.size() &&
                   &(w(0)) == &(v(0))
            );
            for(unsigned short j=0; j<shape.size(); ++j) {
                test(w.shape(j) == v.shape(j));
            }
            for(std::size_t j=0; j<v.size(); ++j) {
                test(w(j) == v(j));
            }
            for(std::size_t j=0; j<v.shape(0); ++j) {
                for(std::size_t k=0; k<v.shape(1); ++k) {
                    test(w(j, k) == v(j, k));
                }
            }
        }
        // false, true
        {
            std::vector<std::size_t> shape(2);
            shape[0] = 6;
            shape[1] = 4;
            andres::View<int, false> v(shape.begin(), shape.end(), data_);
            andres::View<int, true> w(v);

            test(w.dimension() == v.dimension() &&
                   w.size() == v.size() &&
                   &(w(0)) == &(v(0))
            );
            for(unsigned short j=0; j<shape.size(); ++j) {
                test(w.shape(j) == v.shape(j));
            }
            for(std::size_t j=0; j<v.size(); ++j) {
                test(w(j) == v(j));
            }
            for(std::size_t j=0; j<v.shape(0); ++j) {
                for(std::size_t k=0; k<v.shape(1); ++k) {
                    test(w(j, k) == v(j, k));
                }
            }
        }
        // true, true
        {
            std::vector<std::size_t> shape(2);
            shape[0] = 6;
            shape[1] = 4;
            andres::View<int, true> v(shape.begin(), shape.end(), data_);
            andres::View<int, true> w(v);
            
            test(w.dimension() == v.dimension() &&
                   w.size() == v.size() &&
                   &(w(0)) == &(v(0))
            );
            for(unsigned short j=0; j<shape.size(); ++j) {
                test(w.shape(j) == v.shape(j));
            }
            for(std::size_t j=0; j<v.size(); ++j) {
                test(w(j) == v(j));
            }
            for(std::size_t j=0; j<v.shape(0); ++j) {
                for(std::size_t k=0; k<v.shape(1); ++k) {
                    test(w(j, k) == v(j, k));
                }
            }
        }
    }
    // 3D 
    {
        // false, false
        {
            std::vector<std::size_t> shape(3);
            shape[0] = 3;
            shape[1] = 4;
            shape[2] = 2;
            andres::View<int, false> v(shape.begin(), shape.end(), data_);
            andres::View<int, false> w(v);
            
            test(w.dimension() == v.dimension() &&
                   w.size() == v.size() &&
                   &(w(0)) == &(v(0))
            );
            for(unsigned short j=0; j<shape.size(); ++j) {
                test(w.shape(j) == v.shape(j));
            }
            for(std::size_t j=0; j<v.size(); ++j) {
                test(w(j) == v(j));
            }
            for(std::size_t j=0; j<v.shape(0); ++j) {
                for(std::size_t k=0; k<v.shape(1); ++k) {
                    for(std::size_t p=0; p<v.shape(2); ++p) {
                        test(v(j, k, p) == w(j, k, p));
                    }
                }
            }
        }
        // false, true
        {
            std::vector<std::size_t> shape(3);
            shape[0] = 3;
            shape[1] = 4;
            shape[2] = 2;
            andres::View<int, false> v(shape.begin(), shape.end(), data_);
            andres::View<int, true> w(v);
            
            test(w.dimension() == v.dimension() &&
                   w.size() == v.size() &&
                   &(w(0)) == &(v(0))
            );
            for(unsigned short j=0; j<shape.size(); ++j) {
                test(w.shape(j) == v.shape(j));
            }
            for(std::size_t j=0; j<v.size(); ++j) {
                test(w(j) == v(j));
            }
            for(std::size_t j=0; j<v.shape(0); ++j) {
                for(std::size_t k=0; k<v.shape(1); ++k) {
                    for(std::size_t p=0; p<v.shape(2); ++p) {
                        test(v(j, k, p) == w(j, k, p));
                    }
                }
            }
        }
        // true, true
        {
            std::vector<std::size_t> shape(3);
            shape[0] = 3;
            shape[1] = 4;
            shape[2] = 2;
            andres::View<int, true> v(shape.begin(), shape.end(), data_);
            andres::View<int, true> w(v);
            
            test(w.dimension() == v.dimension() &&
                   w.size() == v.size() &&
                   &(w(0)) == &(v(0))
            );
            for(unsigned short j=0; j<shape.size(); ++j) {
                test(w.shape(j) == v.shape(j));
            }
            for(std::size_t j=0; j<v.size(); ++j) {
                test(w(j) == v(j));
            }
            for(std::size_t j=0; j<v.shape(0); ++j) {
                for(std::size_t k=0; k<v.shape(1); ++k) {
                    for(std::size_t p=0; p<v.shape(2); ++p) {
                        test(v(j, k, p) == w(j, k, p));
                    }
                }
            }
        }
    }
}